

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

SuspendedRequest * __thiscall
kj::HttpServer::Connection::suspend
          (SuspendedRequest *__return_storage_ptr__,Connection *this,SuspendableRequest *suspendable
          )

{
  StringPtr url;
  ArrayPtr<unsigned_char> leftoverParam;
  bool bVar1;
  Array<unsigned_char> *other;
  HttpHeaders local_128;
  char *local_c8;
  size_t sStack_c0;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_b8;
  ArrayDisposer *local_a8;
  uchar *puStack_a0;
  Array<unsigned_char> local_98;
  undefined1 local_80 [8];
  ReleasedBuffer released;
  undefined1 local_50 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:7435:5)>
  _kjDefer7435;
  Fault local_30;
  Fault f;
  DebugExpression<bool> _kjCondition;
  SuspendableRequest *suspendable_local;
  Connection *this_local;
  
  f.exception._6_1_ = anon_unknown_36::HttpInputStreamImpl::canSuspend(&this->httpInput);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[65]>
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1d0a,FAILED,"httpInput.canSuspend()",
               "_kjCondition,\"suspend() may only be called before the request body is consumed\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),
               (char (*) [65])"suspend() may only be called before the request body is consumed");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  released.leftover.size_ = (size_t)this;
  defer<kj::HttpServer::Connection::suspend(kj::HttpServer::SuspendableRequest&)::_lambda()_1_>
            ((kj *)local_50,(Type *)&released.leftover.size_);
  anon_unknown_36::HttpInputStreamImpl::releaseBuffer((ReleasedBuffer *)local_80,&this->httpInput);
  other = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)local_80);
  Array<unsigned_char>::Array(&local_98,other);
  local_a8 = released.buffer.disposer;
  puStack_a0 = released.leftover.ptr;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::OneOf(&local_b8,&suspendable->method);
  local_c8 = (suspendable->url).content.ptr;
  sStack_c0 = (suspendable->url).content.size_;
  HttpHeaders::cloneShallow(&local_128,suspendable->headers);
  leftoverParam.size_ = (size_t)puStack_a0;
  leftoverParam.ptr = (uchar *)local_a8;
  url.content.size_ = sStack_c0;
  url.content.ptr = local_c8;
  SuspendedRequest::SuspendedRequest
            (__return_storage_ptr__,&local_98,leftoverParam,&local_b8,url,&local_128);
  HttpHeaders::~HttpHeaders(&local_128);
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(&local_b8);
  Array<unsigned_char>::~Array(&local_98);
  anon_unknown_36::HttpInputStreamImpl::ReleasedBuffer::~ReleasedBuffer((ReleasedBuffer *)local_80);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:7435:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:7435:5)>
               *)local_50);
  return __return_storage_ptr__;
}

Assistant:

SuspendedRequest suspend(SuspendableRequest& suspendable) {
    KJ_REQUIRE(httpInput.canSuspend(),
        "suspend() may only be called before the request body is consumed");
    KJ_DEFER(suspended = true);
    auto released = httpInput.releaseBuffer();
    return {
      kj::mv(released.buffer),
      released.leftover,
      suspendable.method,
      suspendable.url,
      suspendable.headers.cloneShallow(),
    };
  }